

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  int *__args_1;
  __shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    __args_1 = (int *)(**(code **)(*(long *)(this->current_).
                                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
                                            .
                                            super__Head_base<0UL,_testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_false>
                                            ._M_head_impl.impl_._M_t.
                                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>_>_>
                                            .
                                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>_*,_false>
                                  + 0x28))();
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
                          .super__Tuple_impl<1UL,_testing::internal::ParamIterator<int>_>.
                          super__Head_base<1UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                + 0x28))();
    std::
    make_shared<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>,void(*const&)(int_const*,int,int,unsigned_char*),int_const&>
              ((_func_void_int_ptr_int_int_uchar_ptr **)&_Stack_28,__args_1);
    std::
    __shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->current_value_).
                 super___shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>,_(__gnu_cxx::_Lock_policy)2>
                ,&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }